

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

bcf_hrec_t * bcf_hrec_dup(bcf_hrec_t *hrec)

{
  int iVar1;
  char **ppcVar2;
  int iVar3;
  bcf_hrec_t *pbVar4;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  pbVar4 = (bcf_hrec_t *)calloc(1,0x30);
  pbVar4->type = hrec->type;
  if (hrec->key != (char *)0x0) {
    pcVar5 = strdup(hrec->key);
    pbVar4->key = pcVar5;
  }
  if (hrec->value != (char *)0x0) {
    pcVar5 = strdup(hrec->value);
    pbVar4->value = pcVar5;
  }
  iVar1 = hrec->nkeys;
  lVar8 = (long)iVar1;
  pbVar4->nkeys = iVar1;
  ppcVar6 = (char **)malloc(lVar8 * 8);
  pbVar4->keys = ppcVar6;
  ppcVar7 = (char **)malloc(lVar8 * 8);
  pbVar4->vals = ppcVar7;
  if (0 < lVar8) {
    ppcVar2 = hrec->keys;
    lVar9 = 0;
    iVar10 = 0;
    do {
      pcVar5 = ppcVar2[lVar9];
      if (pcVar5 == (char *)0x0) {
LAB_00113cd5:
        if (hrec->vals[lVar9] != (char *)0x0) {
          pcVar5 = strdup(hrec->vals[lVar9]);
          ppcVar7[iVar10] = pcVar5;
        }
        iVar10 = iVar10 + 1;
      }
      else {
        iVar3 = strcmp("IDX",pcVar5);
        if (iVar3 != 0) {
          pcVar5 = strdup(pcVar5);
          ppcVar6[iVar10] = pcVar5;
          goto LAB_00113cd5;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
    if (iVar1 != iVar10) {
      pbVar4->nkeys = iVar10;
    }
  }
  return pbVar4;
}

Assistant:

bcf_hrec_t *bcf_hrec_dup(bcf_hrec_t *hrec)
{
    bcf_hrec_t *out = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
    out->type = hrec->type;
    if ( hrec->key ) out->key = strdup(hrec->key);
    if ( hrec->value ) out->value = strdup(hrec->value);
    out->nkeys = hrec->nkeys;
    out->keys = (char**) malloc(sizeof(char*)*hrec->nkeys);
    out->vals = (char**) malloc(sizeof(char*)*hrec->nkeys);
    int i, j = 0;
    for (i=0; i<hrec->nkeys; i++)
    {
        if ( hrec->keys[i] && !strcmp("IDX",hrec->keys[i]) ) continue;
        if ( hrec->keys[i] ) out->keys[j] = strdup(hrec->keys[i]);
        if ( hrec->vals[i] ) out->vals[j] = strdup(hrec->vals[i]);
        j++;
    }
    if ( i!=j ) out->nkeys -= i-j;   // IDX was omitted
    return out;
}